

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

void __thiscall LTFlightData::~LTFlightData(LTFlightData *this)

{
  std::recursive_mutex::lock(&this->dataAccessMutex);
  DestroyAircraft(this);
  if (this->probeRef != (XPLMProbeRef)0x0) {
    XPLMDestroyProbe();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
  FDStaticData::~FDStaticData(&this->statData);
  std::__cxx11::string::~string((string *)&this->rwyId);
  std::_Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>::
  ~_Deque_base(&(this->dynDataDeque).
                super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>
              );
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base
            (&(this->posToAdd).super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  std::_Deque_base<positionTy,_std::allocator<positionTy>_>::~_Deque_base
            (&(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>);
  std::__cxx11::string::~string((string *)&this->labelStat);
  std::__cxx11::string::~string((string *)&(this->acKey).key);
  return;
}

Assistant:

LTFlightData::~LTFlightData()
{
    try {
//        LOG_MSG(logDEBUG, "FD destroyed for %s", key().c_str());
        // access guarded by a mutex
        std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);
        // make sure aircraft is removed, too
        DestroyAircraft();
        // Release probe handle
        if (probeRef)
            XPLMDestroyProbe(probeRef);
    } catch(const std::system_error& e) {
        LOG_MSG(logERR, ERR_LOCK_ERROR, key().c_str(), e.what());
    }
}